

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

int luv_new_pipe(lua_State *L)

{
  int iVar1;
  uv_pipe_t *handle;
  uv_loop_t *loop;
  luv_handle_t *plVar2;
  int iVar3;
  
  iVar3 = 1;
  luaL_checktype(L,1,1);
  iVar1 = lua_toboolean(L,1);
  handle = (uv_pipe_t *)luv_newuserdata(L,0x108);
  loop = luv_loop(L);
  iVar1 = uv_pipe_init(loop,handle,iVar1);
  if (iVar1 < 0) {
    lua_settop(L,-2);
    luv_error(L,iVar1);
    iVar3 = 3;
  }
  else {
    plVar2 = luv_setup_handle(L);
    handle->data = plVar2;
  }
  return iVar3;
}

Assistant:

static int luv_new_pipe(lua_State* L) {
  uv_pipe_t* handle;
  int ipc, ret;
  luv_ctx_t* ctx = luv_context(L);
  ipc = luv_optboolean(L, 1, 0);
  handle = (uv_pipe_t*)luv_newuserdata(L, sizeof(*handle));
  ret = uv_pipe_init(ctx->loop, handle, ipc);
  if (ret < 0) {
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  handle->data = luv_setup_handle(L, ctx);
  return 1;
}